

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_match_time.c
# Opt level: O0

void excluded(archive *m)

{
  wchar_t wVar1;
  archive_entry *entry;
  archive *in_RDI;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  archive_entry *ae;
  void *in_stack_00000020;
  char *in_stack_ffffffffffffffe8;
  char *pcVar2;
  
  entry = archive_entry_new();
  wVar1 = assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                           (wchar_t)((ulong)in_RDI >> 0x20),(wchar_t)in_RDI,(char *)entry,
                           in_stack_ffffffffffffffe8);
  if (wVar1 != L'\0') {
    archive_entry_copy_pathname(entry,in_stack_ffffffffffffffe8);
    archive_entry_set_mtime(entry,0x1ec7,999);
    failure("It should be excluded");
    archive_match_time_excluded(in_RDI,entry);
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12eda9,in_stack_00000020);
    archive_match_excluded((archive *)ae,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12ede9,in_stack_00000020);
    archive_entry_set_mtime(entry,0x1ec8,0);
    failure("It should be excluded");
    archive_match_time_excluded(in_RDI,entry);
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12ee4a,in_stack_00000020);
    archive_match_excluded((archive *)ae,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12ee8a,in_stack_00000020);
    archive_entry_set_mtime(entry,0x1ec8,1);
    failure("It should not be excluded");
    archive_match_time_excluded(in_RDI,entry);
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12eee9,in_stack_00000020);
    archive_match_excluded((archive *)ae,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    pcVar2 = (char *)0x0;
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12ef26,in_stack_00000020);
    archive_entry_copy_pathname(entry,pcVar2);
    archive_entry_set_mtime(entry,0x1ec7,999);
    failure("It should not be excluded");
    archive_match_time_excluded(in_RDI,entry);
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12ef96,in_stack_00000020);
    archive_match_excluded((archive *)ae,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12efd3,in_stack_00000020);
    archive_entry_set_mtime(entry,0x1ec8,0);
    failure("It should not be excluded");
    archive_match_time_excluded(in_RDI,entry);
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f031,in_stack_00000020);
    archive_match_excluded((archive *)ae,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f06e,in_stack_00000020);
    archive_entry_set_mtime(entry,0x1ec8,1);
    failure("It should not be excluded");
    archive_match_time_excluded(in_RDI,entry);
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f0cd,in_stack_00000020);
    archive_match_excluded((archive *)ae,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    pcVar2 = (char *)0x0;
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f10a,in_stack_00000020);
    archive_entry_copy_pathname(entry,pcVar2);
    archive_entry_set_mtime(entry,0x1ec7,999);
    failure("It should be excluded");
    archive_match_time_excluded(in_RDI,entry);
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f17d,in_stack_00000020);
    archive_match_excluded((archive *)ae,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f1bd,in_stack_00000020);
    archive_entry_set_mtime(entry,0x1ec8,0);
    failure("It should be excluded");
    archive_match_time_excluded(in_RDI,entry);
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f21e,in_stack_00000020);
    archive_match_excluded((archive *)ae,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f25e,in_stack_00000020);
    archive_entry_set_mtime(entry,0x1ec8,1);
    failure("It should be excluded");
    archive_match_time_excluded(in_RDI,entry);
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f2c0,in_stack_00000020);
    archive_match_excluded((archive *)ae,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    pcVar2 = (char *)0x0;
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f300,in_stack_00000020);
    archive_entry_copy_pathname(entry,pcVar2);
    archive_entry_set_mtime(entry,0x1ec7,999);
    failure("It should not be excluded");
    archive_match_time_excluded(in_RDI,entry);
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f370,in_stack_00000020);
    archive_match_excluded((archive *)ae,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f3ad,in_stack_00000020);
    archive_entry_set_mtime(entry,0x1ec8,0);
    failure("It should not be excluded");
    archive_match_time_excluded(in_RDI,entry);
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f40b,in_stack_00000020);
    archive_match_excluded((archive *)ae,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f448,in_stack_00000020);
    archive_entry_set_mtime(entry,0x1ec8,1);
    failure("It should not be excluded");
    archive_match_time_excluded(in_RDI,entry);
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f4a7,in_stack_00000020);
    archive_match_excluded((archive *)ae,(archive_entry *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    assertion_equal_int((char *)ae,unaff_retaddr_00,(longlong)in_RDI,(char *)entry,0,
                        (char *)0x12f4e4,in_stack_00000020);
    archive_entry_free((archive_entry *)0x12f4ee);
  }
  return;
}

Assistant:

static void
excluded(struct archive *m)
{
	struct archive_entry *ae;

	if (!assert((ae = archive_entry_new()) != NULL))
		return;

	archive_entry_copy_pathname(ae, "file1");
	archive_entry_set_mtime(ae, 7879, 999);
	failure("It should be excluded");
	assertEqualInt(1, archive_match_time_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_set_mtime(ae, 7880, 0);
	failure("It should be excluded");
	assertEqualInt(1, archive_match_time_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_set_mtime(ae, 7880, 1);
	failure("It should not be excluded");
	assertEqualInt(0, archive_match_time_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));

	archive_entry_copy_pathname(ae, "file2");
	archive_entry_set_mtime(ae, 7879, 999);
	failure("It should not be excluded");
	assertEqualInt(0, archive_match_time_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_set_mtime(ae, 7880, 0);
	failure("It should not be excluded");
	assertEqualInt(0, archive_match_time_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_set_mtime(ae, 7880, 1);
	failure("It should not be excluded");
	assertEqualInt(0, archive_match_time_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));

	archive_entry_copy_pathname(ae, "file3");
	archive_entry_set_mtime(ae, 7879, 999);
	failure("It should be excluded");
	assertEqualInt(1, archive_match_time_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_set_mtime(ae, 7880, 0);
	failure("It should be excluded");
	assertEqualInt(1, archive_match_time_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_set_mtime(ae, 7880, 1);
	failure("It should be excluded");
	assertEqualInt(1, archive_match_time_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));

	/*
	 * "file4" is not registered, that sort of a file should not be
	 * excluded with any mtime.
	 */
	archive_entry_copy_pathname(ae, "file4");
	archive_entry_set_mtime(ae, 7879, 999);
	failure("It should not be excluded");
	assertEqualInt(0, archive_match_time_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_set_mtime(ae, 7880, 0);
	failure("It should not be excluded");
	assertEqualInt(0, archive_match_time_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_set_mtime(ae, 7880, 1);
	failure("It should not be excluded");
	assertEqualInt(0, archive_match_time_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));


	/* Clean up. */
	archive_entry_free(ae);
}